

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O3

al_fixed al_fixhypot(al_fixed x,al_fixed y)

{
  int iVar1;
  float fVar2;
  
  fVar2 = hypotf((float)x * 1.5258789e-05,(float)y * 1.5258789e-05);
  if (fVar2 <= 32767.0) {
    if (-32767.0 <= fVar2) {
      iVar1 = (int)((double)fVar2 * 65536.0 + *(double *)(&DAT_001b08c0 + (ulong)(fVar2 < 0.0) * 8))
      ;
    }
    else {
      al_set_errno(0x22);
      iVar1 = -0x7fffffff;
    }
  }
  else {
    al_set_errno(0x22);
    iVar1 = 0x7fffffff;
  }
  return iVar1;
}

Assistant:

al_fixed al_fixhypot(al_fixed x, al_fixed y)
{
   return al_ftofix(hypotf(al_fixtof(x), al_fixtof(y)));
}